

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsearch.h
# Opt level: O0

void __thiscall
SearchTask<std::vector<example_*,_std::allocator<example_*>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
::SearchTask(SearchTask<std::vector<example_*,_std::allocator<example_*>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             *this,vw *vw_obj)

{
  example *peVar1;
  task_data *ptVar2;
  long in_RSI;
  undefined8 *in_RDI;
  char *unaff_retaddr;
  example *in_stack_00000008;
  task_data *d;
  example *in_stack_000000a8;
  vw *in_stack_000000b0;
  size_t in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__SearchTask_00473b28;
  in_RDI[1] = in_RSI;
  in_RDI[2] = *(undefined8 *)(in_RSI + 0x280);
  peVar1 = VW::alloc_examples(in_stack_ffffffffffffffe8,(size_t)in_RDI);
  in_RDI[3] = peVar1;
  VW::read_line((vw *)d,in_stack_00000008,unaff_retaddr);
  VW::setup_example(in_stack_000000b0,in_stack_000000a8);
  peVar1 = VW::alloc_examples(in_stack_ffffffffffffffe8,(size_t)in_RDI);
  in_RDI[4] = peVar1;
  VW::read_line((vw *)d,in_stack_00000008,unaff_retaddr);
  VW::setup_example(in_stack_000000b0,in_stack_000000a8);
  ptVar2 = Search::search::get_task_data<HookTask::task_data>((search *)in_RDI[2]);
  ptVar2->run_f = _search_run_fn;
  ptVar2->run_setup_f = _search_setup_fn;
  ptVar2->run_takedown_f = _search_takedown_fn;
  ptVar2->run_object = in_RDI;
  ptVar2->extra_data = (void *)0x0;
  ptVar2->extra_data2 = (void *)0x0;
  return;
}

Assistant:

SearchTask(vw& vw_obj) : vw_obj(vw_obj), sch(*(Search::search*)vw_obj.searchstr)
  { bogus_example = VW::alloc_examples(vw_obj.p->lp.label_size, 1);
    VW::read_line(vw_obj, bogus_example, (char*)"1 | x");
    VW::setup_example(vw_obj, bogus_example);

    blank_line = VW::alloc_examples(vw_obj.p->lp.label_size, 1);
    VW::read_line(vw_obj, blank_line, (char*)"");
    VW::setup_example(vw_obj, blank_line);

    HookTask::task_data* d = sch.get_task_data<HookTask::task_data>();
    d->run_f = _search_run_fn;
    d->run_setup_f = _search_setup_fn;
    d->run_takedown_f = _search_takedown_fn;
    d->run_object = this;
    d->extra_data  = NULL;
    d->extra_data2 = NULL;
  }